

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_dun_gen(parser *p)

{
  undefined2 uVar1;
  wchar_t wVar2;
  int iVar3;
  void *pvVar4;
  char *__s1;
  wchar_t value;
  char *label;
  angband_constants *z;
  parser *p_local;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar2 = parser_getint(p,"value");
  if (wVar2 < L'\0') {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar3 = strcmp(__s1,"cent-max");
    uVar1 = (undefined2)wVar2;
    if (iVar3 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x52) = uVar1;
    }
    else {
      iVar3 = strcmp(__s1,"door-max");
      if (iVar3 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x54) = uVar1;
      }
      else {
        iVar3 = strcmp(__s1,"wall-max");
        if (iVar3 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x56) = uVar1;
        }
        else {
          iVar3 = strcmp(__s1,"tunn-max");
          if (iVar3 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x58) = uVar1;
          }
          else {
            iVar3 = strcmp(__s1,"amt-room");
            if (iVar3 == 0) {
              *(undefined2 *)((long)pvVar4 + 0x5a) = uVar1;
            }
            else {
              iVar3 = strcmp(__s1,"amt-item");
              if (iVar3 == 0) {
                *(undefined2 *)((long)pvVar4 + 0x5c) = uVar1;
              }
              else {
                iVar3 = strcmp(__s1,"amt-gold");
                if (iVar3 == 0) {
                  *(undefined2 *)((long)pvVar4 + 0x5e) = uVar1;
                }
                else {
                  iVar3 = strcmp(__s1,"pit-max");
                  if (iVar3 != 0) {
                    return PARSE_ERROR_UNDEFINED_DIRECTIVE;
                  }
                  *(undefined2 *)((long)pvVar4 + 0x60) = uVar1;
                }
              }
            }
          }
        }
      }
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_constants_dun_gen(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "cent-max"))
		z->level_room_max = value;
	else if (streq(label, "door-max"))
		z->level_door_max = value;
	else if (streq(label, "wall-max"))
		z->wall_pierce_max = value;
	else if (streq(label, "tunn-max"))
		z->tunn_grid_max = value;
	else if (streq(label, "amt-room"))
		z->room_item_av = value;
	else if (streq(label, "amt-item"))
		z->both_item_av = value;
	else if (streq(label, "amt-gold"))
		z->both_gold_av = value;
	else if (streq(label, "pit-max"))
		z->level_pit_max = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}